

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall
PFData_test_compareFuncSame_Test::PFData_test_compareFuncSame_Test
          (PFData_test_compareFuncSame_Test *this)

{
  PFData_test *in_RDI;
  
  PFData_test::PFData_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__PFData_test_compareFuncSame_Test_001ae030;
  return;
}

Assistant:

TEST_F(PFData_test, compareFuncSame){
    PFData test1("tests/inputs/press.init.pfb");
    test1.loadHeader();
    test1.loadData();
    PFData test2("tests/inputs/press.init.pfb");
    test2.loadHeader();
    test2.loadData();

    //none
    auto res = test1.compare(test2, nullptr);
    EXPECT_EQ(res, PFData::differenceType::none);


    //{Z,Y,X}
    test1.setZ(test1.getZ()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::z);
    test1.setZ(test1.getZ()-1.0);

    test1.setY(test1.getY()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::y);
    test1.setY(test1.getY()-1.0);

    test1.setX(test1.getX()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::x);
    test1.setX(test1.getX()-1.0);

    //D{Z,Y,X}
    test1.setDZ(test1.getDZ()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::dZ);
    test1.setDZ(test1.getDZ()-1.0);

    test1.setDY(test1.getDY()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::dY);
    test1.setDY(test1.getDY()-1.0);

    test1.setDX(test1.getDX()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::dX);
    test1.setDX(test1.getDX()-1.0);

    //N{Z,Y,X}
    test1.setNZ(test1.getNZ()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::nZ);
    test1.setNZ(test1.getNZ()-1.0);

    test1.setNY(test1.getNY()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::nY);
    test1.setNY(test1.getNY()-1.0);

    test1.setNX(test1.getNX()+1.0);
    EXPECT_EQ(test1.compare(test2, nullptr), PFData::differenceType::nX);
    test1.setNX(test1.getNX()-1.0);

    //data
    const int mutIdx = (test1.getNZ() * test1.getNY() * test1.getNX() - 1)/3;
    const auto diffZYX = test1.unflattenIndex(mutIdx);
    test1.getData()[mutIdx]++;

    std::array<int, 3> diffLoc{};
    EXPECT_EQ(test1.compare(test2, &diffLoc), PFData::differenceType::data);
    EXPECT_EQ(diffLoc, diffZYX);    //Ensure reported location is correct

    test1.getData()[mutIdx]--;

    test1.close();
    test2.close();
}